

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ioReadPlaMo.c
# Opt level: O1

int Mop_ManMergeDist1All(Mop_Man_t *p,Vec_Wec_t *vGroups,Vec_Int_t *vStats,int nLimit)

{
  long lVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  Vec_Int_t *vGroup;
  long lVar6;
  
  lVar6 = (long)vGroups->nSize;
  if (lVar6 < 1) {
    iVar4 = 0;
  }
  else {
    iVar4 = 0;
    lVar5 = lVar6 + 1;
    lVar6 = lVar6 << 4;
    do {
      lVar1 = lVar5 + -1;
      if (vGroups->nSize < lVar1) {
LAB_00336727:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecWec.h"
                      ,0x9c,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
      }
      if (*(int *)((long)&vGroups->pArray[-1].nSize + lVar6) != 0) {
        if (lVar5 == 2) {
          puts("Detected constant-1 cover.");
          fflush(_stdout);
          return -1;
        }
        vGroup = (Vec_Int_t *)((long)&vGroups->pArray[-1].nCap + lVar6);
        iVar2 = Mop_ManRemoveIdentical(p,vGroup);
        if ((long)vGroups->nSize <= lVar5 + -3) goto LAB_00336727;
        iVar3 = Mop_ManMergeDist1Pairs
                          (p,vGroup,(Vec_Int_t *)((long)&vGroups->pArray[-2].nCap + lVar6),vStats,
                           nLimit);
        iVar4 = iVar2 + iVar4 + iVar3;
      }
      lVar5 = lVar1;
      lVar6 = lVar6 + -0x10;
    } while (1 < lVar1);
  }
  return iVar4;
}

Assistant:

int Mop_ManMergeDist1All( Mop_Man_t * p, Vec_Wec_t * vGroups, Vec_Int_t * vStats, int nLimit )
{
    Vec_Int_t * vGroup;
    int i, nEqual, nReduce, Count = 0;
    Vec_WecForEachLevelReverse( vGroups, vGroup, i )
    {
        if ( Vec_IntSize(vGroup) == 0 )
            continue;
        if ( i == 0 )
        {
            printf( "Detected constant-1 cover.\n" );
            fflush( stdout );
            return -1;
        }
        nEqual  = Mop_ManRemoveIdentical( p, vGroup );
        nReduce = Mop_ManMergeDist1Pairs( p, vGroup, Vec_WecEntry(vGroups, i-1), vStats, nLimit );
        //Mop_ManMergeDist1Pairs2( p, vGroup, Vec_WecEntry(vGroups, i-1) );
        Count  += nEqual + nReduce;
        //printf( "Group %3d : Equal =%5d. Reduce =%5d.\n", i, nEqual, nReduce );
    }
    return Count;
}